

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Xform *xform,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  uint32_t uVar3;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  stringstream ss;
  char local_204;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  uVar3 = indent;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)xform & 0xffffffff),n);
  poVar2 = ::std::operator<<(local_1a8,(string *)&local_1f8);
  to_string_abi_cxx11_(&local_1d8,(tinyusdz *)(ulong)*(uint *)(this + 0xa98),s);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = ::std::operator<<(poVar2," Xform \"");
  poVar2 = ::std::operator<<(poVar2,(string *)(this + 0xa78));
  ::std::operator<<(poVar2,"\"\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  bVar1 = PrimMetas::authored((PrimMetas *)(this + 0x1a10));
  n_02 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)xform & 0xffffffff),n_00);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_1f8);
    ::std::operator<<(poVar2,"(\n");
    ::std::__cxx11::string::_M_dispose();
    print_prim_metas_abi_cxx11_(&local_1f8,this + 0x1a10,(PrimMeta *)(ulong)((int)xform + 1),uVar3);
    ::std::operator<<(local_1a8,(string *)&local_1f8);
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)xform & 0xffffffff),n_01);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_1f8);
    ::std::operator<<(poVar2,")\n");
    ::std::__cxx11::string::_M_dispose();
    n_02 = extraout_EDX;
  }
  uVar3 = (int)xform + 1;
  pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)xform & 0xffffffff),n_02);
  poVar2 = ::std::operator<<(local_1a8,(string *)&local_1f8);
  ::std::operator<<(poVar2,"{\n");
  ::std::__cxx11::string::_M_dispose();
  print_gprim_predefined<tinyusdz::Xform>(&local_1f8,(Xform *)this,uVar3);
  ::std::operator<<(local_1a8,(string *)&local_1f8);
  ::std::__cxx11::string::_M_dispose();
  print_props(&local_1f8,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x1970),uVar3);
  ::std::operator<<(local_1a8,(string *)&local_1f8);
  ::std::__cxx11::string::_M_dispose();
  local_204 = (char)indent;
  if (local_204 != '\0') {
    pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)xform & 0xffffffff),n_03);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_1f8);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Xform &xform, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(xform.spec) << " Xform \""
     << xform.name << "\"\n";
  if (xform.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(xform.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  ss << print_gprim_predefined(xform, indent + 1);

  ss << print_props(xform.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}